

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialValue::ConfidentialValue(ConfidentialValue *this,string *hex_string)

{
  ByteData *this_00;
  uint8_t *__args;
  uint8_t uVar1;
  size_t sVar2;
  CfdException *this_01;
  pointer puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_88;
  ByteData local_68;
  ByteData local_48;
  
  this->_vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025a020;
  this_00 = &this->data_;
  ByteData::ByteData(this_00,hex_string);
  this->version_ = '\0';
  sVar2 = ByteData::GetDataSize(this_00);
  __args = &this->version_;
  if ((long)sVar2 < 9) {
    if (sVar2 == 0) goto LAB_001e10ed;
    if (sVar2 != 8) goto LAB_001e1103;
    local_88._M_dataplus._M_p = (pointer)0x0;
    local_88._M_string_length = 0;
    local_88.field_2._M_allocated_capacity = 0;
    *__args = '\x01';
    ByteData::GetBytes(&local_68.data_,this_00);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,(iterator)0x0,__args
              );
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
    ByteData::ByteData(&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88)
    ;
    puVar3 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar3 != (pointer)0x0) &&
       (operator_delete(puVar3),
       puVar3 = local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start,
       local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
LAB_001e10cb:
      operator_delete(puVar3);
    }
    if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_001e10df:
    if ((uint8_t *)local_88._M_dataplus._M_p == (uint8_t *)0x0) goto LAB_001e10ed;
  }
  else {
    if ((sVar2 != 9) && (sVar2 != 0x21)) {
LAB_001e1103:
      local_88._M_dataplus._M_p = "cfdcore_elements_transaction.cpp";
      local_88._M_string_length = CONCAT44(local_88._M_string_length._4_4_,0x211);
      local_88.field_2._M_allocated_capacity = (long)"ConvertFromConfidentialValue" + 0xb;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ByteData::GetDataSize(this_00);
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)&local_88,kCfdLogLevelWarning,"Value size Invalid. size={}.",
                 (unsigned_long *)&local_68);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Value size Invalid.","");
      CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_88);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,this_00);
    uVar1 = *local_88._M_dataplus._M_p;
    *__args = uVar1;
    if (uVar1 == '\0') {
      ByteData::ByteData(&local_68);
      puVar3 = (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar3 != (pointer)0x0) goto LAB_001e10cb;
      goto LAB_001e10df;
    }
  }
  operator_delete(local_88._M_dataplus._M_p);
LAB_001e10ed:
  CheckVersion('\0');
  return;
}

Assistant:

ConfidentialValue::ConfidentialValue(const std::string &hex_string)
    : data_(hex_string), version_(0) {
  switch (data_.GetDataSize()) {
    case 0:
      // do nothing
      break;
    case kAssetValueSize: {
      std::vector<uint8_t> bytes;
      version_ = kConfidentialVersion_1;
      const std::vector<uint8_t> &data = data_.GetBytes();
      bytes.push_back(version_);
      std::copy(data.begin(), data.end(), std::back_inserter(bytes));
      data_ = ByteData(bytes);
      break;
    }
    case kConfidentialDataSize:
    case kConfidentialValueSize: {
      const std::vector<uint8_t> &data = data_.GetBytes();
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "Value size Invalid. size={}.", data_.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Value size Invalid.");
  }
  CheckVersion(version_);
}